

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O0

void float_values(WavpackStream *wps,int32_t *values,int32_t num_values)

{
  int shift;
  int32_t num_values_local;
  int32_t *values_local;
  WavpackStream *wps_local;
  
  shift = ((uint)wps->float_max_exp - (uint)wps->float_norm_exp) + (uint)wps->float_shift;
  num_values_local = num_values;
  values_local = values;
  if (shift < 0x21) {
    if (shift < -0x20) {
      shift = -0x20;
    }
  }
  else {
    shift = 0x20;
  }
  while (num_values_local != 0) {
    if (shift < 1) {
      if (shift < 0) {
        *values_local = *values_local >> (-(byte)shift & 0x1f);
      }
    }
    else {
      *values_local = *values_local << ((byte)shift & 0x1f);
    }
    if (*values_local < 0x800000) {
      if (*values_local < -0x800000) {
        *values_local = -0x800000;
      }
    }
    else {
      *values_local = 0x7fffff;
    }
    values_local = values_local + 1;
    num_values_local = num_values_local + -1;
  }
  return;
}

Assistant:

void float_values (WavpackStream *wps, int32_t *values, int32_t num_values)
{
    int shift = wps->float_max_exp - wps->float_norm_exp + wps->float_shift;

    if (shift > 32)
        shift = 32;
    else if (shift < -32)
        shift = -32;

    while (num_values--) {
        if (shift > 0)
            *values <<= shift;
        else if (shift < 0)
            *values >>= -shift;

        if (*values > 8388607L)
            *values = 8388607L;
        else if (*values < -8388608L)
            *values = -8388608L;

        values++;
    }
}